

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

bool __thiscall
GF2::MP<135UL,_GF2::MOLex<135UL>_>::Calc(MP<135UL,_GF2::MOLex<135UL>_> *this,WW<135UL> *val)

{
  bool bVar1;
  const_iterator this_00;
  WW<135UL> *in_RDI;
  const_iterator iter;
  bool ret;
  list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_> *in_stack_ffffffffffffffc8;
  _Self local_20;
  byte local_11;
  
  local_11 = 0;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>::begin
                 (in_stack_ffffffffffffffc8);
  while( true ) {
    this_00 = std::__cxx11::list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>::end
                        (in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=(&local_20,(_Self *)&stack0xffffffffffffffd8);
    if (!bVar1) break;
    std::_List_const_iterator<GF2::MM<135UL>_>::operator->
              ((_List_const_iterator<GF2::MM<135UL>_> *)0x17ba35);
    bVar1 = MM<135UL>::Calc((MM<135UL> *)this_00._M_node,in_RDI);
    local_11 = (bool)(local_11 & 1) != bVar1;
    std::_List_const_iterator<GF2::MM<135UL>_>::operator++(&local_20);
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool Calc(const WW<_n>& val) const
	{
		bool ret = 0;
		for (const_iterator iter = begin(); iter != end(); ++iter)
			ret ^= iter->Calc(val);
		return ret;
	}